

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNdr.c
# Opt level: O0

Wlc_Ntk_t * Wlc_ReadNdr(char *pFileName)

{
  void *pData_00;
  Wlc_Ntk_t *pWVar1;
  Abc_Frame_t *pAbc;
  Wlc_Ntk_t *pNtk;
  void *pData;
  char *pFileName_local;
  
  pData_00 = Ndr_Read(pFileName);
  pWVar1 = Wlc_NtkFromNdr(pData_00);
  pAbc = Abc_FrameGetGlobalFrame();
  Abc_FrameInputNdr(pAbc,pData_00);
  return pWVar1;
}

Assistant:

Wlc_Ntk_t * Wlc_ReadNdr( char * pFileName )
{
    void * pData = Ndr_Read( pFileName );
    Wlc_Ntk_t * pNtk = Wlc_NtkFromNdr( pData );
    //char * ppNames[10] = { NULL, "a", "b", "c", "d", "e", "f", "g", "h", "i" };
    //Ndr_WriteVerilog( NULL, pData, ppNames );
    //Ndr_Delete( pData );
    Abc_FrameInputNdr( Abc_FrameGetGlobalFrame(), pData );
    return pNtk;
}